

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O2

int32 gauden_dist_norm(gauden_t *g,int32 n_top,gauden_dist_t ***dist,uint8 *active)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int32 iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  lVar3 = (long)g->n_mgau;
  if (lVar3 < 2) {
    uVar8 = 0;
    uVar7 = (ulong)(uint)n_top;
    if (n_top < 1) {
      uVar7 = uVar8;
    }
    iVar5 = 0;
    for (; (long)uVar8 < (long)g->n_feat; uVar8 = uVar8 + 1) {
      iVar2 = (*dist)[uVar8]->dist;
      for (lVar3 = 1; lVar3 < n_top; lVar3 = lVar3 + 1) {
        iVar2 = logmath_add(g->logmath,iVar2,(*dist)[uVar8][lVar3].dist);
      }
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        (*dist)[uVar8][uVar4].dist = (*dist)[uVar8][uVar4].dist - iVar2;
      }
      iVar5 = iVar5 + iVar2;
    }
  }
  else {
    if (n_top < 1) {
      n_top = 0;
    }
    iVar2 = -0x38000000;
    for (lVar6 = 0; lVar6 != lVar3; lVar6 = lVar6 + 1) {
      if ((active == (uint8 *)0x0) || (active[lVar6] != '\0')) {
        uVar1 = g->n_feat;
        if (g->n_feat < 1) {
          uVar1 = 0;
        }
        for (uVar7 = 0; uVar7 != uVar1; uVar7 = uVar7 + 1) {
          for (uVar8 = 0; (uint)n_top != uVar8; uVar8 = uVar8 + 1) {
            if (iVar2 <= dist[lVar6][uVar7][uVar8].dist) {
              iVar2 = dist[lVar6][uVar7][uVar8].dist;
            }
          }
        }
      }
    }
    for (lVar6 = 0; lVar6 != lVar3; lVar6 = lVar6 + 1) {
      if ((active == (uint8 *)0x0) || (active[lVar6] != '\0')) {
        uVar1 = g->n_feat;
        if (g->n_feat < 1) {
          uVar1 = 0;
        }
        for (uVar7 = 0; uVar7 != uVar1; uVar7 = uVar7 + 1) {
          for (uVar8 = 0; (uint)n_top != uVar8; uVar8 = uVar8 + 1) {
            dist[lVar6][uVar7][uVar8].dist = dist[lVar6][uVar7][uVar8].dist - iVar2;
          }
        }
      }
    }
    iVar5 = iVar2 * g->n_feat;
  }
  return iVar5;
}

Assistant:

int32
gauden_dist_norm(gauden_t * g, int32 n_top, gauden_dist_t *** dist,
                 uint8 * active)
{
    int32 gid, f, t;
    int32 sum, scale;

    if (g->n_mgau > 1) {
        /* Normalize by subtracting max(density values) from each density */
        return (gauden_dist_norm_global(g, n_top, dist, active));
    }

    /* Normalize by subtracting log(sum of density values) from each density */
    gid = 0;
    scale = 0;
    for (f = 0; f < g->n_feat; f++) {
        sum = dist[gid][f][0].dist;
        for (t = 1; t < n_top; t++)
            sum = logmath_add(g->logmath, sum, dist[gid][f][t].dist);

        for (t = 0; t < n_top; t++)
            dist[gid][f][t].dist -= sum;

        scale += sum;
    }

    return scale;               /* Scale factor applied to EVERY senone score */
}